

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall kpeg::TeeBuf::TeeBuf(TeeBuf *this,streambuf *sb1,streambuf *sb2)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  std::streambuf::streambuf(in_RDI);
  *in_RDI = &PTR__TeeBuf_00186c90;
  in_RDI[8] = in_RSI;
  in_RDI[9] = in_RDX;
  return;
}

Assistant:

TeeBuf::TeeBuf(std::streambuf * sb1, std::streambuf * sb2) :
        m_sb1(sb1),
        m_sb2(sb2)
    {}